

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O3

void __thiscall gl4cts::DirectStateAccess::Framebuffers::FunctionalTest::Clean(FunctionalTest *this)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar2;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  if (this->m_fbo_1st != 0) {
    (**(code **)(lVar2 + 0x440))(1,&this->m_fbo_1st);
    this->m_fbo_1st = 0;
  }
  if (this->m_fbo_2nd != 0) {
    (**(code **)(lVar2 + 0x440))(1,&this->m_fbo_2nd);
    this->m_fbo_2nd = 0;
  }
  if (this->m_rbo_color != 0) {
    (**(code **)(lVar2 + 0x460))(1,&this->m_rbo_color);
    this->m_rbo_color = 0;
  }
  if (this->m_rbo_depth_stencil != 0) {
    (**(code **)(lVar2 + 0x460))(1,&this->m_rbo_depth_stencil);
    this->m_rbo_depth_stencil = 0;
  }
  if (this->m_to_color != 0) {
    (**(code **)(lVar2 + 0x480))(1,&this->m_to_color);
    this->m_to_color = 0;
  }
  if (this->m_po != 0) {
    (**(code **)(lVar2 + 0x1680))(0);
    (**(code **)(lVar2 + 0x448))(this->m_po);
    this->m_po = 0;
  }
  if (this->m_vao_stencil_pass_quad != 0) {
    (**(code **)(lVar2 + 0x438))(1,&this->m_vao_stencil_pass_quad);
    this->m_vao_stencil_pass_quad = 0;
  }
  if (this->m_vao_depth_pass_quad != 0) {
    (**(code **)(lVar2 + 0x438))(1,&this->m_vao_depth_pass_quad);
    this->m_vao_depth_pass_quad = 0;
  }
  if (this->m_vao_color_pass_quad != 0) {
    (**(code **)(lVar2 + 0x438))(1,&this->m_vao_color_pass_quad);
    this->m_vao_color_pass_quad = 0;
  }
  if (this->m_bo_stencil_pass_quad != 0) {
    (**(code **)(lVar2 + 0x438))(1,&this->m_bo_stencil_pass_quad);
    this->m_bo_stencil_pass_quad = 0;
  }
  if (this->m_bo_depth_pass_quad != 0) {
    (**(code **)(lVar2 + 0x438))(1,&this->m_bo_depth_pass_quad);
    this->m_bo_depth_pass_quad = 0;
  }
  if (this->m_bo_color_pass_quad != 0) {
    (**(code **)(lVar2 + 0x438))(1,&this->m_bo_color_pass_quad);
    this->m_bo_color_pass_quad = 0;
  }
  (**(code **)(lVar2 + 0x12c8))(0x207,0,0xff);
  (**(code **)(lVar2 + 0x12e8))(0x1e00,0x1e00,0x1e00);
  (**(code **)(lVar2 + 0x12d8))(0xff);
  (**(code **)(lVar2 + 0x238))(1,1,1,1);
  (**(code **)(lVar2 + 0x4a0))(0x201);
  (**(code **)(lVar2 + 0x4a8))(1);
  (**(code **)(lVar2 + 0x4e8))(0xb90);
  (**(code **)(lVar2 + 0x4e8))(0xb71);
  do {
    iVar1 = (**(code **)(lVar2 + 0x800))();
  } while (iVar1 != 0);
  return;
}

Assistant:

void FunctionalTest::Clean()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Releas GL objects. */
	if (m_fbo_1st)
	{
		gl.deleteFramebuffers(1, &m_fbo_1st);

		m_fbo_1st = 0;
	}

	if (m_fbo_2nd)
	{
		gl.deleteFramebuffers(1, &m_fbo_2nd);

		m_fbo_2nd = 0;
	}

	if (m_rbo_color)
	{
		gl.deleteRenderbuffers(1, &m_rbo_color);

		m_rbo_color = 0;
	}

	if (m_rbo_depth_stencil)
	{
		gl.deleteRenderbuffers(1, &m_rbo_depth_stencil);

		m_rbo_depth_stencil = 0;
	}

	if (m_to_color)
	{
		gl.deleteTextures(1, &m_to_color);

		m_to_color = 0;
	}

	if (m_po)
	{
		gl.useProgram(0);

		gl.deleteProgram(m_po);

		m_po = 0;
	}

	if (m_vao_stencil_pass_quad)
	{
		gl.deleteBuffers(1, &m_vao_stencil_pass_quad);

		m_vao_stencil_pass_quad = 0;
	}

	if (m_vao_depth_pass_quad)
	{
		gl.deleteBuffers(1, &m_vao_depth_pass_quad);

		m_vao_depth_pass_quad = 0;
	}

	if (m_vao_color_pass_quad)
	{
		gl.deleteBuffers(1, &m_vao_color_pass_quad);

		m_vao_color_pass_quad = 0;
	}

	if (m_bo_stencil_pass_quad)
	{
		gl.deleteBuffers(1, &m_bo_stencil_pass_quad);

		m_bo_stencil_pass_quad = 0;
	}

	if (m_bo_depth_pass_quad)
	{
		gl.deleteBuffers(1, &m_bo_depth_pass_quad);

		m_bo_depth_pass_quad = 0;
	}

	if (m_bo_color_pass_quad)
	{
		gl.deleteBuffers(1, &m_bo_color_pass_quad);

		m_bo_color_pass_quad = 0;
	}

	/* Reseting state. */
	gl.stencilFunc(GL_ALWAYS, 0, 0xff);
	gl.stencilOp(GL_KEEP, GL_KEEP, GL_KEEP);
	gl.stencilMask(0xff);
	gl.colorMask(GL_TRUE, GL_TRUE, GL_TRUE, GL_TRUE);
	gl.depthFunc(GL_LESS);
	gl.depthMask(GL_TRUE);
	gl.disable(GL_STENCIL_TEST);
	gl.disable(GL_DEPTH_TEST);

	/* Clean errors. */
	while (gl.getError())
		;
}